

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManRestart(Ga2_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Abs_Par_t *pAVar5;
  sat_solver2 *s;
  Vec_Int_t *vToAdd;
  long lVar6;
  int Lit;
  lit local_14;
  
  pGVar4 = p->pGia;
  if ((pGVar4 == (Gia_Man_t *)0x0) || (pGVar4->vGateClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("p->pGia != NULL && p->pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x45c,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  iVar3 = pGVar4->vCis->nSize;
  if (iVar3 <= pGVar4->nRegs) {
    __assert_fail("v < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cf,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
  }
  if (iVar3 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = *pGVar4->vCis->pArray;
  if (((long)iVar3 < 0) || (pGVar4->nObjs <= iVar3)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (-1 < *(long *)(pGVar4->pObjs + iVar3)) {
    __assert_fail("Gia_ManPi(p->pGia, 0)->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x45d,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  if (p->pSat != (sat_solver2 *)0x0) {
    sat_solver2_delete(p->pSat);
  }
  s = sat_solver2_new();
  p->pSat = s;
  pAVar5 = p->pPars;
  uVar1 = pAVar5->nLearnedDelta;
  uVar2 = pAVar5->nLearnedPerce;
  iVar3 = pAVar5->nLearnedStart;
  s->nLearntMax = iVar3;
  s->nLearntStart = iVar3;
  s->nLearntDelta = uVar1;
  s->nLearntRatio = uVar2;
  sat_solver2_addclause(s,&local_14,(lit *)&stack0xfffffffffffffff0,-1);
  Ga2_ManShrinkAbs(p,1,1,1);
  vToAdd = Ga2_ManAbsDerive(p->pGia);
  if (p->pSat->pPrf2 == (Prf_Man_t *)0x0) {
    if (p->pPars->iFrame < 0) {
      Ga2_ManAddToAbs(p,vToAdd);
      if (vToAdd->pArray != (int *)0x0) {
        free(vToAdd->pArray);
      }
      free(vToAdd);
      p->LimAbs = p->vAbs->nSize;
      p->LimPpi = p->vValues->nSize;
      lVar6 = (long)p->pPars->nTimeOut;
      if (lVar6 != 0) {
        p->pSat->nRuntimeLimit = lVar6 * 1000000 + p->timeStart;
      }
      memset(p->pTable,0,(long)p->nTable * 0x18);
      return;
    }
    __assert_fail("p->pPars->iFrame < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x46c,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  __assert_fail("p->pSat->pPrf2 == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                ,0x46b,"void Ga2_ManRestart(Ga2_Man_t *)");
}

Assistant:

void Ga2_ManRestart( Ga2_Man_t * p )
{
    Vec_Int_t * vToAdd;
    int Lit = 1;
    assert( p->pGia != NULL && p->pGia->vGateClasses != NULL );
    assert( Gia_ManPi(p->pGia, 0)->fPhase ); // marks are set
    // clear SAT variable numbers (begin with 1)
    if ( p->pSat ) sat_solver2_delete( p->pSat );
    p->pSat      = sat_solver2_new();
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // add clause x0 = 0  (lit0 = 1; lit1 = 0)
    sat_solver2_addclause( p->pSat, &Lit, &Lit + 1, -1 );
    // remove previous abstraction
    Ga2_ManShrinkAbs( p, 1, 1, 1 );
    // start new abstraction
    vToAdd = Ga2_ManAbsDerive( p->pGia );
    assert( p->pSat->pPrf2 == NULL );
    assert( p->pPars->iFrame < 0 );
    Ga2_ManAddToAbs( p, vToAdd );
    Vec_IntFree( vToAdd );
    p->LimAbs = Vec_IntSize(p->vAbs);
    p->LimPpi = Vec_IntSize(p->vValues);
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + p->timeStart );
    // clean the hash table
    memset( p->pTable, 0, 6 * sizeof(int) * p->nTable );
}